

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::UnitTest::UponLeavingGTest(UnitTest *this)

{
  OsStackTraceGetterInterface *pOVar1;
  
  pOVar1 = internal::UnitTestImpl::os_stack_trace_getter(this->impl_);
  (*pOVar1->_vptr_OsStackTraceGetterInterface[3])(pOVar1);
  return;
}

Assistant:

void UnitTest::UponLeavingGTest() {
  impl()->os_stack_trace_getter()->UponLeavingGTest();
}